

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O1

DEdgeVec * libDAI::GrowRootedTree(DEdgeVec *__return_storage_ptr__,Graph *T,size_t Root)

{
  pointer *ppDVar1;
  undefined1 auVar2 [16];
  iterator iVar3;
  _Base_ptr p_Var4;
  size_type sVar5;
  size_type sVar6;
  _Base_ptr p_Var7;
  const_iterator __position;
  _Self __tmp;
  Graph Gr;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> treeV;
  DEdge local_a8;
  size_t local_98;
  _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
  local_90;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((T->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_98 = Root;
    std::
    _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
    ::_Rb_tree(&local_90,&T->_M_t);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&local_60,&local_98);
    if (local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __position._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        while ((_Rb_tree_header *)__position._M_node != &local_90._M_impl.super__Rb_tree_header) {
          p_Var7 = __position._M_node + 1;
          sVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&local_60,(key_type *)p_Var7);
          sVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&local_60,(key_type *)&__position._M_node[1]._M_parent);
          if (sVar5 == 0) {
            if (sVar6 == 0) {
              __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            }
            else {
              auVar2._0_4_ = p_Var7->_M_color;
              auVar2._4_4_ = *(undefined4 *)&p_Var7->field_0x4;
              auVar2._8_8_ = p_Var7->_M_parent;
              local_a8 = (DEdge)vpermilps_avx(auVar2,0x4e);
              iVar3._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::
                _M_realloc_insert<libDAI::DEdge>(__return_storage_ptr__,iVar3,&local_a8);
              }
              else {
                (iVar3._M_current)->n1 = local_a8.n1;
                (iVar3._M_current)->n2 = local_a8.n2;
                ppDVar1 = &(__return_storage_ptr__->
                           super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppDVar1 = *ppDVar1 + 1;
              }
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&local_60,(unsigned_long *)p_Var7);
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
              std::
              _Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
              ::erase_abi_cxx11_((_Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
                                  *)&local_90,__position);
              __position._M_node = p_Var7;
            }
          }
          else {
            p_Var4 = __position._M_node[1]._M_parent;
            local_a8 = *(DEdge *)p_Var7;
            iVar3._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::
              _M_realloc_insert<libDAI::DEdge>(__return_storage_ptr__,iVar3,&local_a8);
            }
            else {
              (iVar3._M_current)->n1 = *(key_type *)p_Var7;
              (iVar3._M_current)->n2 = (size_t)p_Var4;
              ppDVar1 = &(__return_storage_ptr__->
                         super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppDVar1 = *ppDVar1 + 1;
            }
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&local_60,(unsigned_long *)&__position._M_node[1]._M_parent);
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            std::
            _Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
            ::erase_abi_cxx11_((_Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
                                *)&local_90,__position);
            __position._M_node = p_Var7;
          }
        }
        __position._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      } while (local_90._M_impl.super__Rb_tree_header._M_node_count != 0);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
    ::~_Rb_tree(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

DEdgeVec GrowRootedTree( const Graph & T, size_t Root ) {
        DEdgeVec result;
        if( T.size() == 0 )
            return result;
        else {
            // Make a copy
            Graph Gr = T;

            // Nodes in the tree
            set<size_t> treeV;

            // Start with the root
            treeV.insert( Root );
            
            // Keep adding edges until done
            while( !(Gr.empty()) )
                for( Graph::iterator e = Gr.begin(); e != Gr.end(); ) {
                    bool e1_in_treeV = treeV.count( e->n1 );
                    bool e2_in_treeV = treeV.count( e->n2 );
                    assert( !(e1_in_treeV && e2_in_treeV) );
                    if( e1_in_treeV ) {
                        // Add directed edge, pointing away from the root
                        result.push_back( DEdge( e->n1, e->n2 ) );
                        treeV.insert( e->n2 );
                        // Erase the edge
                        Gr.erase( e++ );
                    } else if( e2_in_treeV ) {
                        result.push_back( DEdge( e->n2, e->n1 ) );
                        treeV.insert( e->n1 );
                        // Erase the edge
                        Gr.erase( e++ );
                    } else
                        e++;
                }

            return result;
        }
    }